

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::updateLastInputTime(WindowImplX11 *this,Time time)

{
  Atom AVar1;
  long in_RSI;
  long in_RDI;
  Atom netWmUserTime;
  undefined7 in_stack_ffffffffffffffc0;
  allocator<char> in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  long local_10 [2];
  
  if ((in_RSI != 0) && (in_RSI != *(long *)(in_RDI + 0x480))) {
    local_10[0] = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    AVar1 = getAtom(in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    if (AVar1 != 0) {
      XChangeProperty(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),AVar1,6,0x20,0
                      ,local_10,1);
    }
    *(long *)(in_RDI + 0x480) = local_10[0];
  }
  return;
}

Assistant:

void WindowImplX11::updateLastInputTime(::Time time)
{
    if (time && (time != m_lastInputTime))
    {
        Atom netWmUserTime = getAtom("_NET_WM_USER_TIME", true);

        if (netWmUserTime)
        {
            XChangeProperty(m_display,
                            m_window,
                            netWmUserTime,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&time),
                            1);
        }

        m_lastInputTime = time;
    }
}